

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O2

void __thiscall
agge::pod_vector<agge::tests::(anonymous_namespace)::B>::grow
          (pod_vector<agge::tests::(anonymous_namespace)::B> *this,count_t by)

{
  B *pBVar1;
  B *pBVar2;
  B *pBVar3;
  uint uVar4;
  ulong uVar5;
  B *pBVar6;
  long lVar7;
  uint uVar8;
  
  pBVar2 = this->_begin;
  pBVar3 = this->_end;
  uVar5 = (long)this->_limit - (long)pBVar2;
  uVar4 = (uint)(uVar5 >> 3);
  uVar8 = (uint)(uVar5 >> 4) & 0x7fffffff;
  if (uVar4 < by * 2) {
    uVar8 = by;
  }
  uVar5 = (ulong)(uVar8 + uVar4 + (uint)(uVar8 == 0));
  pBVar6 = (B *)operator_new__(uVar5 * 8);
  for (lVar7 = 0; pBVar1 = (B *)((long)&pBVar2->abc + lVar7), pBVar1 != pBVar3; lVar7 = lVar7 + 8) {
    *(B *)((long)&pBVar6->abc + lVar7) = *pBVar1;
  }
  if (pBVar2 != (B *)0x0) {
    operator_delete__(pBVar2);
  }
  this->_begin = pBVar6;
  this->_end = (B *)((long)&pBVar6->abc + ((long)pBVar3 - (long)pBVar2 & 0x7fffffff8U));
  this->_limit = pBVar6 + uVar5;
  return;
}

Assistant:

inline void pod_vector<T>::grow(count_t by)
	{
		count_t size = this->size(), new_capacity = capacity();

		new_capacity += agge_max(2 * by > new_capacity ? by : new_capacity / 2, 1u);

		T *buffer = new T[new_capacity], *p = buffer;
		
		for (iterator i = _begin; i != _end; )
			*p++ = *i++;
		delete []_begin;
		_begin = buffer;
		_end = _begin + size;
		_limit = _begin + new_capacity;
	}